

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall QTreeView::doItemsLayout(QTreeView *this)

{
  QTreeViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  ulong uVar2;
  char cVar3;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *pDVar4;
  size_t sVar5;
  long in_FS_OFFSET;
  piter it;
  piter it_00;
  QModelIndex local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  if (this_00->hasRemovedItems != true) goto LAB_005a3f3c;
  this_00->hasRemovedItems = false;
  pDVar4 = (this_00->expandedIndexes).q_hash.d;
  if (pDVar4 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) {
    pDVar4 = (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0;
    sVar5 = 0;
LAB_005a3d7a:
    it.bucket = sVar5;
    it.d = pDVar4;
    if (pDVar4 != (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0 ||
        sVar5 != 0) goto LAB_005a3d86;
  }
  else {
    if (1 < (uint)(pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      pDVar4 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
               detached(pDVar4);
      (this_00->expandedIndexes).q_hash.d = pDVar4;
    }
    if (pDVar4->spans->offsets[0] == 0xff) {
      uVar2 = 1;
      do {
        sVar5 = uVar2;
        if (pDVar4->numBuckets == sVar5) {
          pDVar4 = (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0;
          sVar5 = 0;
          break;
        }
        uVar2 = sVar5 + 1;
      } while (pDVar4->spans[sVar5 >> 7].offsets[(uint)sVar5 & 0x7f] == 0xff);
      goto LAB_005a3d7a;
    }
    it.bucket = 0;
    it.d = pDVar4;
LAB_005a3d86:
    do {
      sVar5 = it.bucket;
      pDVar4 = it.d;
      cVar3 = QPersistentModelIndex::isValid();
      if (cVar3 == '\0') {
        it = (piter)QHash<QPersistentModelIndex,_QHashDummyValue>::erase
                              (&(this_00->expandedIndexes).q_hash,(const_iterator)it);
      }
      else {
        do {
          if (pDVar4->numBuckets - 1 == sVar5) {
            it = (piter)ZEXT816(0);
            break;
          }
          sVar5 = sVar5 + 1;
          it.bucket = sVar5;
          it.d = pDVar4;
        } while (pDVar4->spans[sVar5 >> 7].offsets[(uint)sVar5 & 0x7f] == 0xff);
      }
    } while ((it.d != (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) ||
            (it.bucket != 0));
  }
  pDVar4 = (this_00->hiddenIndexes).q_hash.d;
  if (pDVar4 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) {
    pDVar4 = (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0;
    sVar5 = 0;
LAB_005a3e9a:
    it_00.bucket = sVar5;
    it_00.d = pDVar4;
    if (pDVar4 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0 &&
        sVar5 == 0) goto LAB_005a3f3c;
  }
  else {
    if (1 < (uint)(pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      pDVar4 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
               detached(pDVar4);
      (this_00->hiddenIndexes).q_hash.d = pDVar4;
    }
    if (pDVar4->spans->offsets[0] == 0xff) {
      uVar2 = 1;
      do {
        sVar5 = uVar2;
        if (pDVar4->numBuckets == sVar5) {
          pDVar4 = (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0;
          sVar5 = 0;
          break;
        }
        uVar2 = sVar5 + 1;
      } while (pDVar4->spans[sVar5 >> 7].offsets[(uint)sVar5 & 0x7f] == 0xff);
      goto LAB_005a3e9a;
    }
    it_00.bucket = 0;
    it_00.d = pDVar4;
  }
  do {
    sVar5 = it_00.bucket;
    pDVar4 = it_00.d;
    cVar3 = QPersistentModelIndex::isValid();
    if (cVar3 == '\0') {
      it_00 = (piter)QHash<QPersistentModelIndex,_QHashDummyValue>::erase
                               (&(this_00->hiddenIndexes).q_hash,(const_iterator)it_00);
    }
    else {
      do {
        if (pDVar4->numBuckets - 1 == sVar5) {
          it_00 = (piter)ZEXT816(0);
          break;
        }
        sVar5 = sVar5 + 1;
        it_00.bucket = sVar5;
        it_00.d = pDVar4;
      } while (pDVar4->spans[sVar5 >> 7].offsets[(uint)sVar5 & 0x7f] == 0xff);
    }
  } while ((it_00.d != (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) ||
          (it_00.bucket != 0));
LAB_005a3f3c:
  QList<QTreeViewItem>::clear(&this_00->viewItems);
  local_48.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::operator_cast_to_QModelIndex
            (&local_48,&(this_00->super_QAbstractItemViewPrivate).root);
  pQVar1 = (this_00->super_QAbstractItemViewPrivate).model;
  cVar3 = (**(code **)(*(long *)pQVar1 + 0x88))(pQVar1,&local_48);
  if (cVar3 != '\0') {
    QTreeViewPrivate::layout(this_00,-1,false,false);
  }
  QAbstractItemView::doItemsLayout((QAbstractItemView *)this);
  (**(code **)(*(long *)&(this_00->header->super_QAbstractItemView).super_QAbstractScrollArea.
                         super_QFrame.super_QWidget + 0x220))();
  QTreeViewPrivate::updateAccessibility(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::doItemsLayout()
{
    Q_D(QTreeView);
    if (d->hasRemovedItems) {
        //clean the QSet that may contains old (and this invalid) indexes
        d->hasRemovedItems = false;
        QSet<QPersistentModelIndex>::iterator it = d->expandedIndexes.begin();
        while (it != d->expandedIndexes.end()) {
            if (!it->isValid())
                it = d->expandedIndexes.erase(it);
            else
                ++it;
        }
        it = d->hiddenIndexes.begin();
        while (it != d->hiddenIndexes.end()) {
            if (!it->isValid())
                it = d->hiddenIndexes.erase(it);
            else
                ++it;
        }
    }
    d->viewItems.clear(); // prepare for new layout
    QModelIndex parent = d->root;
    if (d->model->hasChildren(parent)) {
        d->layout(-1);
    }
    QAbstractItemView::doItemsLayout();
    d->header->doItemsLayout();
    d->updateAccessibility();
}